

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall backward::Colorize::set_color(Colorize *this,type ccode)

{
  ostream *poVar1;
  int in_ESI;
  undefined8 *in_RDI;
  
  if ((*(byte *)((long)in_RDI + 9) & 1) != 0) {
    poVar1 = std::operator<<((ostream *)*in_RDI,"\x1b[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
    std::operator<<(poVar1,"m");
    *(bool *)(in_RDI + 1) = in_ESI != 0x27;
  }
  return;
}

Assistant:

void set_color(Color::type ccode) {
    if (!_enabled)
      return;

    // I assume that the terminal can handle basic colors. Seriously I
    // don't want to deal with all the termcap shit.
    _os << "\033[" << static_cast<int>(ccode) << "m";
    _reset = (ccode != Color::reset);
  }